

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O1

int __thiscall
TPZSkylMatrix<std::complex<float>_>::Subst_Forward
          (TPZSkylMatrix<std::complex<float>_> *this,TPZFMatrix<std::complex<float>_> *B)

{
  float fVar1;
  float fVar2;
  complex<float> **ppcVar3;
  complex<float> *pcVar4;
  int iVar5;
  undefined4 extraout_var;
  long lVar6;
  long lVar7;
  complex<float> *pcVar8;
  undefined8 *puVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  undefined8 uVar14;
  _ComplexT _Var15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  long local_60;
  undefined4 extraout_var_00;
  
  lVar6 = (B->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
  iVar5 = (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])();
  if ((lVar6 != CONCAT44(extraout_var,iVar5)) ||
     ((this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fDecomposed != '\x03')) {
    TPZMatrix<std::complex<float>_>::Error
              ("virtual int TPZSkylMatrix<std::complex<float>>::Subst_Forward(TPZFMatrix<TVar> *) const [TVar = std::complex<float>]"
               ,"TPZSkylMatrix::Subst_Forward not decomposed with cholesky");
  }
  iVar5 = (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])(this);
  lVar6 = CONCAT44(extraout_var_00,iVar5);
  if (0 < (B->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol) {
    lVar11 = 0;
    local_60 = 0;
    do {
      if (lVar6 < 1) {
        lVar13 = 0;
      }
      else {
        lVar12 = 0;
        do {
          if (((B->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow <= lVar12) ||
             ((B->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol <= local_60)) {
            TPZFMatrix<std::complex<float>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar7 = (B->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow * lVar11;
          fVar20 = *(float *)((long)&B->fElem[lVar12]._M_value + lVar7);
          lVar13 = lVar12;
        } while ((((fVar20 == 0.0) && (!NAN(fVar20))) &&
                 (fVar20 = *(float *)((long)&B->fElem[lVar12]._M_value + lVar7 + 4), fVar20 == 0.0))
                && ((!NAN(fVar20) && (lVar12 = lVar12 + 1, lVar13 = lVar6, lVar6 != lVar12))));
      }
      if (lVar13 < lVar6) {
        lVar12 = lVar13 * 8 + -8;
        do {
          ppcVar3 = (this->fElem).fStore;
          pcVar4 = ppcVar3[lVar13 + 1];
          if (((B->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow <= lVar13) ||
             ((B->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol <= local_60)) {
            TPZFMatrix<std::complex<float>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          pcVar8 = ppcVar3[lVar13] + 1;
          fVar19 = 0.0;
          fVar20 = 0.0;
          if (pcVar8 < pcVar4) {
            puVar9 = (undefined8 *)
                     ((long)&B->fElem->_M_value +
                     (B->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow * lVar11 +
                     lVar12);
            do {
              fVar1 = *(float *)&pcVar8->_M_value;
              fVar2 = *(float *)((long)&pcVar8->_M_value + 4);
              uVar14 = *puVar9;
              fVar16 = (float)((ulong)uVar14 >> 0x20);
              fVar18 = fVar1 * (float)uVar14 + fVar16 * fVar2;
              fVar17 = fVar1 * fVar16 - (float)uVar14 * fVar2;
              if ((NAN(fVar18)) && (NAN(fVar17))) {
                uVar14 = __mulsc3(fVar1,-fVar2,uVar14,fVar16);
                fVar18 = (float)uVar14;
                fVar17 = (float)((ulong)uVar14 >> 0x20);
              }
              fVar19 = fVar19 + fVar18;
              fVar20 = fVar20 + fVar17;
              pcVar8 = pcVar8 + 1;
              puVar9 = puVar9 + -1;
            } while (pcVar8 < pcVar4);
          }
          if (((B->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow <= lVar13) ||
             ((B->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol <= local_60)) {
            TPZFMatrix<std::complex<float>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar7 = lVar13 + 1;
          lVar10 = (B->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow * local_60;
          pcVar4 = B->fElem;
          fVar20 = (float)(pcVar4[lVar10 + lVar13]._M_value >> 0x20) - fVar20;
          _Var15 = CONCAT44(fVar20,(float)pcVar4[lVar10 + lVar13]._M_value - fVar19);
          pcVar4[lVar10 + lVar13]._M_value = _Var15;
          pcVar8 = (this->fElem).fStore[lVar13];
          _Var15 = __divsc3(_Var15,fVar20,(int)pcVar8->_M_value,
                            *(undefined4 *)((long)&pcVar8->_M_value + 4));
          pcVar4[lVar10 + lVar13]._M_value = _Var15;
          lVar12 = lVar12 + 8;
          lVar13 = lVar7;
        } while (lVar7 != lVar6);
      }
      local_60 = local_60 + 1;
      lVar11 = lVar11 + 8;
    } while (local_60 < (B->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol);
  }
  return 1;
}

Assistant:

int
TPZSkylMatrix<TVar>::Subst_Forward( TPZFMatrix<TVar> *B ) const
{
    if ( (B->Rows() != this->Dim()) || this->fDecomposed != ECholesky)
        TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__,"TPZSkylMatrix::Subst_Forward not decomposed with cholesky");
    
#ifdef DUMP_BEFORE_SUBST
    dump_matrices(this, B, "TPZSkylMatrix::Subst_Forward(B)");
#endif
    
    //	std::cout << "SubstForward this " << (void *) this << " neq " << Dim() << " normb " << Norm(*B) << std::endl;
    int64_t dimension=this->Dim();
    for ( int64_t j = 0; j < B->Cols(); j++ )
    {
        int64_t k=0;
        while (k<dimension && (*B)(k,j) == TVar(0)) {
            k++;
        }
        //		std::cout << "kstart " << k << std::endl;
        for (; k < dimension; k++ )
        {
            // Faz sum = SOMA( A[k,i] * B[i,j] ), para i = 1, ..., k-1.
            //
            TVar sum = 0.0;
            TVar *elem_ki = fElem[k]+1;
            TVar *end_ki  = fElem[k+1];
            TVar* BPtr = &(*B)(k,j);   //(k-1,j)
            //	for ( int i = k-1; elem_ki < end_ki; i-- )
            //	  sum += (*elem_ki++) * B->GetVal( i, j );
            
            //EBORIN:
            // Is this a hot-spot?
            // Is it vectorized?
            if constexpr(is_complex<TVar>::value)
                while(elem_ki < end_ki) sum += std::conj(*elem_ki++) * (*--BPtr);//(*BPtr--)
            else
                while(elem_ki < end_ki) sum += (*elem_ki++) * (*--BPtr);//(*BPtr--)
            // Faz B[k,j] = (B[k,j] - sum) / A[k,k].
            //
            //	B->PutVal( k, j, (B->GetVal(k, j) - sum) / row_k->pElem[0] );
            BPtr = &(*B)(k,j);
            *BPtr-= sum;
            *BPtr /= fElem[k][0];
        }
    }
    
    return( 1 );
}